

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O2

void __thiscall Storage::Tape::TZX::get_csw_recording_block(TZX *this)

{
  FileHolder *this_00;
  uint8_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t sampling_rate;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_block;
  CSW csw;
  Pulse local_a8;
  undefined1 local_98 [104];
  
  this_00 = &this->file_;
  uVar4 = FileHolder::get32le(this_00);
  uVar3 = FileHolder::get16le(this_00);
  sampling_rate = FileHolder::get24le(this_00);
  uVar1 = FileHolder::get8(this_00);
  FileHolder::get32le(this_00);
  FileHolder::read((FileHolder *)local_98,(int)this_00,(void *)(ulong)(uVar4 - 10),in_RCX);
  CSW::CSW((CSW *)(local_98 + 0x18),
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,(uint)(uVar1 == '\x02')
           ,this->current_level_,sampling_rate);
  while( true ) {
    bVar2 = CSW::is_at_end((CSW *)(local_98 + 0x18));
    if (bVar2) break;
    local_a8 = Tape::get_next_pulse((Tape *)(local_98 + 0x18));
    this->current_level_ = local_a8.type == High;
    PulseQueuedTape::emplace_back(&this->super_PulseQueuedTape,&local_a8);
  }
  post_gap(this,(uint)uVar3);
  CSW::~CSW((CSW *)(local_98 + 0x18));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  return;
}

Assistant:

void TZX::get_csw_recording_block() {
	const uint32_t block_length = file_.get32le();
	const uint16_t pause_after_block = file_.get16le();
	const uint32_t sampling_rate = file_.get24le();
	const uint8_t compression_type = file_.get8();
	const uint32_t number_of_compressed_pulses = file_.get32le();

	std::vector<uint8_t> raw_block = file_.read(block_length - 10);

	CSW csw(std::move(raw_block), (compression_type == 2) ? CSW::CompressionType::ZRLE : CSW::CompressionType::RLE, current_level_, sampling_rate);
	while(!csw.is_at_end()) {
		Tape::Pulse next_pulse = csw.get_next_pulse();
		current_level_ = (next_pulse.type == Tape::Pulse::High);
		emplace_back(std::move(next_pulse));
	}

	(void)number_of_compressed_pulses;
	post_gap(pause_after_block);
}